

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O2

void re2::DumpRegexpAppending(Regexp *re,string *s)

{
  int *piVar1;
  uint8 uVar2;
  Rune RVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Rune *pRVar7;
  CharClass *pCVar8;
  string *psVar9;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar10;
  int i_1;
  ulong uVar11;
  int i_2;
  int i;
  long lVar12;
  uint *puVar13;
  Rune r;
  string sep;
  
  if (re->op_ < 0x16) {
    if ((re->op_ - 7 < 4) && ((re->parse_flags_ & 0x40) != 0)) {
      std::__cxx11::string::append((char *)s);
    }
    std::__cxx11::string::append((char *)s);
    uVar2 = re->op_;
    if (uVar2 == '\x03') {
      if (((re->parse_flags_ & 1) != 0) && (RVar3 = Regexp::rune(re), RVar3 - 0x61U < 0x1a)) {
        std::__cxx11::string::append((char *)s);
      }
      uVar2 = re->op_;
    }
    if ((uVar2 == '\x04') && ((re->parse_flags_ & 1) != 0)) {
      lVar12 = 0;
      do {
        iVar4 = Regexp::nrunes(re);
        if (iVar4 <= lVar12) goto LAB_00112d66;
        pRVar7 = Regexp::runes(re);
        piVar1 = pRVar7 + lVar12;
        lVar12 = lVar12 + 1;
      } while (*piVar1 - 0x7bU < 0xffffffe6);
      std::__cxx11::string::append((char *)s);
    }
  }
  else {
    StringAppendF(s,"op%d");
  }
LAB_00112d66:
  std::__cxx11::string::append((char *)s);
  switch(re->op_) {
  case '\x03':
    r = Regexp::rune(re);
    iVar4 = runetochar((char *)&sep,&r);
    *(undefined1 *)((long)&sep._M_dataplus._M_p + (long)iVar4) = 0;
    goto LAB_00112f99;
  case '\x04':
    for (lVar12 = 0; iVar4 = Regexp::nrunes(re), lVar12 < iVar4; lVar12 = lVar12 + 1) {
      pRVar7 = Regexp::runes(re);
      r = pRVar7[lVar12];
      iVar4 = runetochar((char *)&sep,&r);
      *(undefined1 *)((long)&sep._M_dataplus._M_p + (long)iVar4) = 0;
      std::__cxx11::string::append((char *)s);
    }
    break;
  case '\x05':
  case '\x06':
    for (uVar11 = 0; uVar11 < re->nsub_; uVar11 = uVar11 + 1) {
      paVar10 = &re->field_5;
      if (1 < re->nsub_) {
        paVar10 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
      }
      DumpRegexpAppending(paVar10[uVar11].subone_,s);
    }
    break;
  case '\a':
  case '\b':
  case '\t':
    goto switchD_00112d93_caseD_7;
  case '\n':
    uVar5 = Regexp::min(re);
    uVar6 = Regexp::max(re);
    StringPrintf_abi_cxx11_(&sep,"%d,%d ",(ulong)uVar5,(ulong)uVar6);
    std::__cxx11::string::append((string *)s);
    std::__cxx11::string::~string((string *)&sep);
    goto switchD_00112d93_caseD_7;
  case '\v':
    iVar4 = Regexp::cap(re);
    if (iVar4 == 0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sep,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dump.cc"
                 ,0x7c);
      std::operator<<((ostream *)&sep._M_string_length,"kRegexpCapture cap() == 0");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&sep);
    }
    psVar9 = Regexp::name_abi_cxx11_(re);
    if (psVar9 != (string *)0x0) {
      Regexp::name_abi_cxx11_(re);
      std::__cxx11::string::append((string *)s);
      std::__cxx11::string::append((char *)s);
    }
switchD_00112d93_caseD_7:
    if (re->nsub_ < 2) {
      paVar10 = &re->field_5;
    }
    else {
      paVar10 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    DumpRegexpAppending(paVar10->subone_,s);
    break;
  case '\x13':
    if ((short)re->parse_flags_ < 0) break;
LAB_00112f99:
    std::__cxx11::string::append((char *)s);
    break;
  case '\x14':
    sep._M_dataplus._M_p = (pointer)&sep.field_2;
    sep._M_string_length = 0;
    sep.field_2._M_local_buf[0] = '\0';
    pCVar8 = Regexp::cc(re);
    for (puVar13 = *(uint **)(pCVar8 + 8); pCVar8 = Regexp::cc(re),
        puVar13 != (uint *)((long)*(int *)(pCVar8 + 0x10) * 8 + *(long *)(pCVar8 + 8));
        puVar13 = puVar13 + 2) {
      uVar5 = *puVar13;
      uVar6 = puVar13[1];
      std::__cxx11::string::append((string *)s);
      if (uVar5 == uVar6) {
        StringPrintf_abi_cxx11_((string *)&r,"%#x",(ulong)uVar5);
        std::__cxx11::string::append((string *)s);
      }
      else {
        StringPrintf_abi_cxx11_((string *)&r,"%#x-%#x",(ulong)uVar5,(ulong)uVar6);
        std::__cxx11::string::append((string *)s);
      }
      std::__cxx11::string::~string((string *)&r);
      std::__cxx11::string::assign((char *)&sep);
    }
    std::__cxx11::string::~string((string *)&sep);
  }
  std::__cxx11::string::append((char *)s);
  return;
}

Assistant:

static void DumpRegexpAppending(Regexp* re, string* s) {
  if (re->op() < 0 || re->op() >= arraysize(kOpcodeNames)) {
    StringAppendF(s, "op%d", re->op());
  } else {
    switch (re->op()) {
      default:
        break;
      case kRegexpStar:
      case kRegexpPlus:
      case kRegexpQuest:
      case kRegexpRepeat:
        if (re->parse_flags() & Regexp::NonGreedy)
          s->append("n");
        break;
    }
    s->append(kOpcodeNames[re->op()]);
    if (re->op() == kRegexpLiteral && (re->parse_flags() & Regexp::FoldCase)) {
      Rune r = re->rune();
      if ('a' <= r && r <= 'z')
        s->append("fold");
    }
    if (re->op() == kRegexpLiteralString && (re->parse_flags() & Regexp::FoldCase)) {
      for (int i = 0; i < re->nrunes(); i++) {
        Rune r = re->runes()[i];
        if ('a' <= r && r <= 'z') {
          s->append("fold");
          break;
        }
      }
    }
  }
  s->append("{");
  switch (re->op()) {
    default:
      break;
    case kRegexpEndText:
      if (!(re->parse_flags() & Regexp::WasDollar)) {
        s->append("\\z");
      }
      break;
    case kRegexpLiteral: {
      Rune r = re->rune();
      char buf[UTFmax+1];
      buf[runetochar(buf, &r)] = 0;
      s->append(buf);
      break;
    }
    case kRegexpLiteralString:
      for (int i = 0; i < re->nrunes(); i++) {
        Rune r = re->runes()[i];
        char buf[UTFmax+1];
        buf[runetochar(buf, &r)] = 0;
        s->append(buf);
      }
      break;
    case kRegexpConcat:
    case kRegexpAlternate:
      for (int i = 0; i < re->nsub(); i++)
        DumpRegexpAppending(re->sub()[i], s);
      break;
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      DumpRegexpAppending(re->sub()[0], s);
      break;
    case kRegexpCapture:
      if (re->cap() == 0)
        LOG(DFATAL) << "kRegexpCapture cap() == 0";
      if (re->name()) {
        s->append(*re->name());
        s->append(":");
      }
      DumpRegexpAppending(re->sub()[0], s);
      break;
    case kRegexpRepeat:
      s->append(StringPrintf("%d,%d ", re->min(), re->max()));
      DumpRegexpAppending(re->sub()[0], s);
      break;
    case kRegexpCharClass: {
      string sep;
      for (CharClass::iterator it = re->cc()->begin();
           it != re->cc()->end(); ++it) {
        RuneRange rr = *it;
        s->append(sep);
        if (rr.lo == rr.hi)
          s->append(StringPrintf("%#x", rr.lo));
        else
          s->append(StringPrintf("%#x-%#x", rr.lo, rr.hi));
        sep = " ";
      }
      break;
    }
  }
  s->append("}");
}